

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMElementImpl.cpp
# Opt level: O1

XMLSize_t __thiscall xercesc_4_0::DOMElementImpl::getChildElementCount(DOMElementImpl *this)

{
  int iVar1;
  undefined4 extraout_var;
  long *plVar2;
  XMLSize_t XVar3;
  
  iVar1 = (*(this->super_DOMElement).super_DOMNode._vptr_DOMNode[0x3c])();
  XVar3 = 0;
  for (plVar2 = (long *)CONCAT44(extraout_var,iVar1); plVar2 != (long *)0x0;
      plVar2 = (long *)(**(code **)(*plVar2 + 0x1f8))(plVar2)) {
    XVar3 = XVar3 + 1;
  }
  return XVar3;
}

Assistant:

XMLSize_t DOMElementImpl::getChildElementCount() const
{
    XMLSize_t count = 0;
    DOMElement* child = getFirstElementChild();
    while (child != NULL) {
        ++count;
        child = child->getNextElementSibling();
    }
    return count;
}